

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void __thiscall ImGuiTabBar::ImGuiTabBar(ImGuiTabBar *this)

{
  ImGuiTabBar *this_local;
  
  ImVector<ImGuiTabItem>::ImVector(&this->Tabs);
  ImRect::ImRect(&this->BarRect);
  ImVec2::ImVec2(&this->FramePadding);
  ImVec2::ImVec2(&this->BackupCursorPos);
  ImGuiTextBuffer::ImGuiTextBuffer(&this->TabsNames);
  memset(this,0,0x98);
  this->PrevFrameVisible = -1;
  this->CurrFrameVisible = -1;
  this->LastTabItemIdx = -1;
  return;
}

Assistant:

ImGuiTabBar::ImGuiTabBar()
{
    memset(this, 0, sizeof(*this));
    CurrFrameVisible = PrevFrameVisible = -1;
    LastTabItemIdx = -1;
}